

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManSetRefsMapped(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *piVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
  }
  iVar1 = p->nObjs;
  piVar5 = (int *)calloc((long)iVar1,4);
  p->pRefs = piVar5;
  pVVar3 = p->vCos;
  if (0 < pVVar3->nSize) {
    piVar4 = pVVar3->pArray;
    lVar7 = 0;
    do {
      iVar2 = piVar4[lVar7];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      piVar5[(int)(iVar2 - (*(uint *)(p->pObjs + iVar2) & 0x1fffffff))] =
           piVar5[(int)(iVar2 - (*(uint *)(p->pObjs + iVar2) & 0x1fffffff))] + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar3->nSize);
  }
  if (1 < iVar1) {
    pVVar3 = p->vMapping;
    uVar8 = (ulong)(uint)pVVar3->nSize;
    sVar6 = 1;
    do {
      if ((long)(int)uVar8 <= (long)sVar6) {
LAB_0020c50d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = pVVar3->pArray;
      if (piVar4[sVar6] != 0) {
        if ((long)(int)uVar8 <= (long)sVar6) goto LAB_0020c50d;
        lVar7 = 0;
        while( true ) {
          lVar9 = (long)piVar4[sVar6];
          if ((lVar9 < 0) || ((uint)uVar8 <= (uint)piVar4[sVar6])) goto LAB_0020c50d;
          if (piVar4[lVar9] <= lVar7) break;
          piVar5[piVar4[lVar9 + lVar7 + 1]] = piVar5[piVar4[lVar9 + lVar7 + 1]] + 1;
          lVar7 = lVar7 + 1;
          uVar8 = (ulong)pVVar3->nSize;
          if ((long)uVar8 <= (long)sVar6) goto LAB_0020c50d;
        }
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != (long)iVar1);
  }
  return;
}

Assistant:

void Gia_ManSetRefsMapped( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i, k, iFan;
    ABC_FREE( p->pRefs );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjRefIncId( p, Gia_ObjFaninId0p(p, pObj) );
    Gia_ManForEachLut( p, i )
        Gia_LutForEachFanin( p, i, iFan, k )
            Gia_ObjRefIncId( p, iFan );
}